

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

Scl_Tree_t * Scl_LibertyParse(char *pFileName,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  char *local_30;
  char *pPos;
  Scl_Tree_t *p;
  char *pcStack_18;
  int fVerbose_local;
  char *pFileName_local;
  
  p._4_4_ = fVerbose;
  pcStack_18 = pFileName;
  pPos = (char *)Scl_LibertyStart(pFileName);
  if ((Scl_Tree_t *)pPos == (Scl_Tree_t *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    local_30 = ((Scl_Tree_t *)pPos)->pContents;
    Scl_LibertyWipeOutComments
              (((Scl_Tree_t *)pPos)->pContents,
               ((Scl_Tree_t *)pPos)->pContents + ((Scl_Tree_t *)pPos)->nContents);
    iVar1 = Scl_LibertyBuildItem
                      ((Scl_Tree_t *)pPos,&local_30,
                       (char *)(*(long *)(pPos + 8) + (long)*(int *)(pPos + 0x10)));
    if (iVar1 == 0) {
      if (p._4_4_ != 0) {
        printf("Parsing finished successfully.  ");
        aVar2 = Abc_Clock();
        Abc_PrintTime(1,"Parsing time",aVar2 - *(long *)(pPos + 0x30));
      }
    }
    else {
      if (*(long *)(pPos + 0x28) != 0) {
        printf("%s",*(undefined8 *)(pPos + 0x28));
      }
      printf("Parsing failed.  ");
      aVar2 = Abc_Clock();
      Abc_PrintTime(1,"Parsing time",aVar2 - *(long *)(pPos + 0x30));
    }
    pFileName_local = pPos;
  }
  return (Scl_Tree_t *)pFileName_local;
}

Assistant:

Scl_Tree_t * Scl_LibertyParse( char * pFileName, int fVerbose )
{
    Scl_Tree_t * p;
    char * pPos;
    if ( (p = Scl_LibertyStart(pFileName)) == NULL )
        return NULL;
    pPos = p->pContents;
    Scl_LibertyWipeOutComments( p->pContents, p->pContents+p->nContents );
    if ( !Scl_LibertyBuildItem( p, &pPos, p->pContents + p->nContents ) == 0 )
    {
        if ( p->pError ) printf( "%s", p->pError );
        printf( "Parsing failed.  " );
        Abc_PrintTime( 1, "Parsing time", Abc_Clock() - p->clkStart );
    }
    else if ( fVerbose )
    {
        printf( "Parsing finished successfully.  " );
        Abc_PrintTime( 1, "Parsing time", Abc_Clock() - p->clkStart );
    }
    return p;
}